

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O3

void __thiscall FDirectory::AddEntry(FDirectory *this,char *fullpath,int size)

{
  uint uVar1;
  size_t sVar2;
  FDirectoryLump *pFVar3;
  FString name;
  FString local_40;
  FString local_38;
  
  uVar1 = TArray<FDirectoryLump,_FDirectoryLump>::Reserve(&this->Lumps,1);
  pFVar3 = (this->Lumps).Array;
  FString::operator=(&pFVar3[uVar1].mFullPath,fullpath);
  sVar2 = strlen((this->super_FResourceFile).Filename);
  FString::FString(&local_38,fullpath + sVar2);
  FString::ToLower(&local_38);
  FString::AttachToOther(&local_40,&local_38);
  pFVar3 = pFVar3 + uVar1;
  FResourceLump::LumpNameSetup(&pFVar3->super_FResourceLump,&local_40);
  FString::~FString(&local_40);
  (pFVar3->super_FResourceLump).LumpSize = size;
  (pFVar3->super_FResourceLump).Owner = &this->super_FResourceFile;
  (pFVar3->super_FResourceLump).Flags = '\0';
  FResourceLump::CheckEmbedded(&pFVar3->super_FResourceLump);
  FString::~FString(&local_38);
  return;
}

Assistant:

void FDirectory::AddEntry(const char *fullpath, int size)
{
	FDirectoryLump *lump_p = &Lumps[Lumps.Reserve(1)];

	// Store the full path here so that we can access the file later, even if it is from a filter directory.
	lump_p->mFullPath = fullpath;

	// [mxd] Convert name to lowercase
	FString name = fullpath + strlen(Filename);
	name.ToLower();

	// The lump's name is only the part relative to the main directory
	lump_p->LumpNameSetup(name);
	lump_p->LumpSize = size;
	lump_p->Owner = this;
	lump_p->Flags = 0;
	lump_p->CheckEmbedded();
}